

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

float * __thiscall
google::protobuf::internal::UntypedMapBase::GetValue<float>(UntypedMapBase *this,NodeBase *node)

{
  TypeKind TVar1;
  int v1;
  int v2;
  char *failure_msg;
  LogMessage *pLVar2;
  float *pfVar3;
  LogMessage local_38;
  Voidify local_21;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  NodeBase *node_local;
  UntypedMapBase *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)node;
  node_local = (NodeBase *)this;
  TVar1 = StaticTypeKind<float>();
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue((uint)TVar1);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue
                 ((uint)((byte)(this->type_info_).field_0x3 >> 4));
  local_20 = absl::lts_20250127::log_internal::Check_EQImpl
                       (v1,v2,
                        "static_cast<int>(StaticTypeKind<T>()) == static_cast<int>(type_info_.value_type)"
                       );
  if (local_20 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
               ,0x152,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  pfVar3 = (float *)GetVoidValue(this,(NodeBase *)absl_log_internal_check_op_result);
  return pfVar3;
}

Assistant:

T* GetValue(NodeBase* node) const {
    // Debug check that `T` matches what we expect from the type info.
    ABSL_DCHECK_EQ(static_cast<int>(StaticTypeKind<T>()),
                   static_cast<int>(type_info_.value_type));
    return reinterpret_cast<T*>(GetVoidValue(node));
  }